

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O0

uint64_t __thiscall cubeb_client::get_stream_position(cubeb_client *this)

{
  int iVar1;
  int rv;
  uint64_t pos;
  cubeb_stream *in_stack_ffffffffffffffd8;
  
  iVar1 = cubeb_stream_get_position(in_stack_ffffffffffffffd8,(uint64_t *)0x104be5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Could not get the position of the stream\n");
  }
  return 0;
}

Assistant:

uint64_t cubeb_client::get_stream_position() const {
  uint64_t pos = 0;
  int rv = cubeb_stream_get_position(stream, &pos);
  if (rv != CUBEB_OK) {
    fprintf(stderr, "Could not get the position of the stream\n");
    return 0;
  }
  return pos;
}